

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Vec3fa embree::cosineSampleHemisphere(Vec2f *s)

{
  long in_RSI;
  undefined8 in_RDI;
  float phi_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  float sinTheta;
  float cosTheta;
  float phi;
  float in_stack_ffffffffffffffd8;
  
  sqrtf(*(float *)(in_RSI + 4));
  phi_00 = sqrtf(1.0 - *(float *)(in_RSI + 4));
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
          cartesian(phi_00,in_stack_ffffffffffffffd8,(float)((ulong)in_RDI >> 0x20));
  return (Vec3fa)aVar1;
}

Assistant:

inline Vec3fa cosineSampleHemisphere(const Vec2f s)
{
  const float phi = 2.0f * float(M_PI) * s.x;
  const float cosTheta = sqrt(s.y);
  const float sinTheta = sqrt(1.0f - s.y);
  return cartesian(phi, sinTheta, cosTheta);
}